

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StartTls-Example.cpp
# Opt level: O0

void ServerThread(bool *bStop)

{
  int local_104;
  duration<long,_std::ratio<1L,_1000L>_> local_100;
  undefined1 local_f1;
  anon_class_8_1_2a7d313a aStack_f0;
  bool bCreated;
  function<void_(const_std::vector<TcpSocket_*,_std::allocator<TcpSocket_*>_>_&)> local_e8;
  anon_class_1_0_00000001 local_c1;
  function<void_(BaseSocket_*)> local_c0;
  function<void_(BaseSocket_*)> local_a0;
  anon_class_1_0_00000001 local_69;
  function<void_(BaseSocket_*)> local_68;
  function<void_(BaseSocket_*)> local_48;
  bool local_21;
  undefined1 local_20 [7];
  bool bClientConnected;
  TcpServer sock;
  bool *bStop_local;
  
  sock.super_BaseSocket.Impl_._M_t.
  super___uniq_ptr_impl<BaseSocketImpl,_std::default_delete<BaseSocketImpl>_>._M_t.
  super__Tuple_impl<0UL,_BaseSocketImpl_*,_std::default_delete<BaseSocketImpl>_>.
  super__Head_base<0UL,_BaseSocketImpl_*,_false>._M_head_impl =
       (__uniq_ptr_data<BaseSocketImpl,_std::default_delete<BaseSocketImpl>,_true,_true>)
       (__uniq_ptr_data<BaseSocketImpl,_std::default_delete<BaseSocketImpl>,_true,_true>)bStop;
  TcpServer::TcpServer((TcpServer *)local_20);
  local_21 = false;
  std::function<void(BaseSocket*)>::function<ServerThread(bool_const*)::__0,void>
            ((function<void(BaseSocket*)> *)&local_68,&local_69);
  BaseSocket::BindErrorFunction(&local_48,(BaseSocket *)local_20,&local_68);
  std::function<void_(BaseSocket_*)>::~function(&local_48);
  std::function<void_(BaseSocket_*)>::~function(&local_68);
  std::function<void(BaseSocket*)>::function<ServerThread(bool_const*)::__1,void>
            ((function<void(BaseSocket*)> *)&local_c0,&local_c1);
  BaseSocket::BindCloseFunction(&local_a0,(BaseSocket *)local_20,&local_c0);
  std::function<void_(BaseSocket_*)>::~function(&local_a0);
  std::function<void_(BaseSocket_*)>::~function(&local_c0);
  aStack_f0.bClientConnected = &local_21;
  std::function<void(std::vector<TcpSocket*,std::allocator<TcpSocket*>>const&)>::
  function<ServerThread(bool_const*)::__2,void>
            ((function<void(std::vector<TcpSocket*,std::allocator<TcpSocket*>>const&)> *)&local_e8,
             &stack0xffffffffffffff10);
  TcpServer::BindNewConnection((TcpServer *)local_20,&local_e8);
  std::function<void_(const_std::vector<TcpSocket_*,_std::allocator<TcpSocket_*>_>_&)>::~function
            (&local_e8);
  local_f1 = TcpServer::Start((TcpServer *)local_20,"0.0.0.0",0xd85);
  while ((*(byte *)sock.super_BaseSocket.Impl_._M_t.
                   super___uniq_ptr_impl<BaseSocketImpl,_std::default_delete<BaseSocketImpl>_>._M_t.
                   super__Tuple_impl<0UL,_BaseSocketImpl_*,_std::default_delete<BaseSocketImpl>_>.
                   super__Head_base<0UL,_BaseSocketImpl_*,_false>._M_head_impl & 1) == 0 ||
         (local_21 & 1U) == 1) {
    local_104 = 10;
    std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
              ((duration<long,std::ratio<1l,1000l>> *)&local_100,&local_104);
    std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(&local_100);
  }
  TcpServer::Close((TcpServer *)local_20);
  TcpServer::~TcpServer((TcpServer *)local_20);
  return;
}

Assistant:

void ServerThread(const bool* bStop)
{
    TcpServer sock;
    bool bClientConnected = false;

    // 3 callback function to handle the server socket events
    sock.BindErrorFunction([&](BaseSocket* pSock) { cout << "Server: socket error" << endl << flush; pSock->Close(); }); // Must call Close function
    sock.BindCloseFunction([&](BaseSocket*) { cout << "Server: socket closing" << endl << flush; });

    sock.BindNewConnection([&](const vector<TcpSocket*>& lstSockets)
    {
        // a list with sockets new connected
        for (auto& pSocket : lstSockets)
        {
            if (pSocket != nullptr)
            {
                bClientConnected = true;

                // 3 callback functions to handle the sockets events
                pSocket->BindFuncBytesReceived([&](TcpSocket* pSock)
                {
                    const size_t nAvalible = pSock->GetBytesAvailable();

                    if (nAvalible == 0) // Socket closed on remote
                    {
                        pSock->Close();
                        return;
                    }

                    auto spBuffer = make_unique<uint8_t[]>(nAvalible + 1);

                    const size_t nRead = pSock->Read(spBuffer.get(), nAvalible);

                    if (nRead > 0)
                    {
                        string strRec(nRead, 0);
                        copy(&spBuffer[0], &spBuffer[nRead], &strRec[0]);

                        if (strRec == "STARTTLS")
                        {
                            SslTcpSocket* pSslTcpSocket = SslTcpSocket::SwitchToSll(pSock);
                            pSock->SelfDestroy();
                            if (pSslTcpSocket->AddServerCertificate("certs/ca-root.crt", "certs/127-0-0-1.crt", "certs/127-0-0-1-key.pem", nullptr) == false)
                            {
                                cout << "Server: can't load certificate" << endl;
                                pSslTcpSocket->Close();
                                return;
                            }
                            pSslTcpSocket->SetAcceptState();
                            pSslTcpSocket->StartReceiving();
                            pSslTcpSocket->Write("Server Hello Message with TLS", 29);
                            return;
                        }

                        stringstream strOutput;
                        strOutput << pSock->GetClientAddr() << " - Server received: " << nRead << " Bytes, \"" << strRec << "\"" << endl;

                        cout << strOutput.str() << flush;

                        strRec = "Server echo: " + strRec;
                        pSock->Write(&strRec[0], strRec.size());

                        //pSock->Close(); // Optional, if you don't close the socket, the connection stays open
                    }
                });
                pSocket->BindErrorFunction([&](BaseSocket* pSock)
                {
                    // there was an error, we close the socket
                    pSock->Close();
                    cout << "Server: accept socket error" << endl << flush;
                });
                pSocket->BindCloseFunction([&](BaseSocket* pSock)
                {
                    // We let the socket destroy it self, use this on sockets received by the server
                    bClientConnected = false;
                    cout << "Server: accept socket closing" << endl << flush;
                });

                pSocket->StartReceiving();  // start to receive data
                pSocket->Write("Server Hello Message none TLS", 29);
            }
        }
    });


    // start der server socket
    const bool bCreated = sock.Start("0.0.0.0", 3461);    // IPv6 use "::1" as address

    while (*bStop == false || bClientConnected == true)
    {
        this_thread::sleep_for(chrono::milliseconds(10));
    }

    // Closing the server socket will not call the close callback
    sock.Close();
}